

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O1

void __thiscall roaring::Roaring64Map::addMany(Roaring64Map *this,size_t n_args,uint64_t *vals)

{
  uint64_t uVar1;
  roaring_bitmap_t *r;
  uint32_t uVar2;
  uint32_t key;
  size_t sVar3;
  roaring_bulk_context_t local_50;
  Roaring64Map *local_40;
  uint64_t *local_38;
  
  local_50.idx = 0;
  local_50.key = 0;
  local_50.typecode = '\0';
  local_50.container._0_7_ = 0;
  local_50.container._7_1_ = 0;
  if (n_args != 0) {
    r = (roaring_bitmap_t *)0x0;
    uVar2 = 0;
    sVar3 = 0;
    local_40 = this;
    local_38 = vals;
    do {
      uVar1 = local_38[sVar3];
      key = (uint32_t)(uVar1 >> 0x20);
      if (r == (roaring_bitmap_t *)0x0 || uVar2 != key) {
        r = (roaring_bitmap_t *)lookupOrCreateInner(local_40,key);
        local_50.container._0_7_ = 0;
        local_50.container._7_1_ = 0;
        local_50.idx = 0;
        local_50.key = 0;
        local_50.typecode = '\0';
        uVar2 = key;
      }
      roaring_bitmap_add_bulk(r,&local_50,(uint32_t)uVar1);
      sVar3 = sVar3 + 1;
    } while (n_args != sVar3);
  }
  return;
}

Assistant:

void addMany(size_t n_args, const uint64_t *vals) {
        // Potentially reduce outer map lookups by optimistically
        // assuming that adjacent values will belong to the same inner bitmap.
        Roaring *last_inner_bitmap = nullptr;
        uint32_t last_value_high = 0;
        BulkContext last_bulk_context;
        for (size_t lcv = 0; lcv < n_args; lcv++) {
            auto value = vals[lcv];
            auto value_high = highBytes(value);
            auto value_low = lowBytes(value);
            if (last_inner_bitmap == nullptr || value_high != last_value_high) {
                last_inner_bitmap = &lookupOrCreateInner(value_high);
                last_value_high = value_high;
                last_bulk_context = BulkContext{};
            }
            last_inner_bitmap->addBulk(last_bulk_context, value_low);
        }
    }